

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O3

ManagedDescriptor * __thiscall ManagedDescriptor::childMayInherit(ManagedDescriptor *this,bool yes)

{
  int __fd;
  uint uVar1;
  
  __fd = this->_descriptor;
  if (__fd < 0) {
    uVar1 = fcntl(__fd,1);
    fcntl(__fd,2,(ulong)((uint)yes | uVar1 & 0xfffffffe));
  }
  return this;
}

Assistant:

ManagedDescriptor &childMayInherit(bool yes) {
    if (isValid()) {
      return *this;
    }

    auto fd = _descriptor;

#if defined(_WIN32)
    SetHandleInformation(fd, HANDLE_FLAG_INHERIT, yes ? TRUE : FALSE);
#else
    if (yes) {
      fcntl(fd, F_SETFD, fcntl(fd, F_GETFD) | FD_CLOEXEC);
    } else {
      fcntl(fd, F_SETFD, fcntl(fd, F_GETFD) & ~FD_CLOEXEC);
    }
#endif
    return *this;
  }